

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyMem.c
# Opt level: O2

void Ivy_ManAddMemory(Ivy_Man_t *p)

{
  Ivy_Obj_t *Entry;
  int iVar1;
  void *Entry_00;
  long lVar2;
  bool bVar3;
  
  if (p->pListFree == (Ivy_Obj_t *)0x0) {
    Entry_00 = malloc(0x50080);
    Vec_PtrPush(p->vChunks,Entry_00);
    Entry = (Ivy_Obj_t *)(((ulong)Entry_00 & 0xffffffffffffff80) + 0x80);
    Vec_PtrPush(p->vPages,Entry);
    p->pListFree = Entry;
    lVar2 = ((ulong)Entry_00 & 0xffffffffffffff80) + 0xd0;
    iVar1 = 0xfff;
    while (bVar3 = iVar1 != 0, iVar1 = iVar1 + -1, bVar3) {
      *(long *)(lVar2 + -0x50) = lVar2;
      lVar2 = lVar2 + 0x50;
    }
    *(undefined8 *)(lVar2 + -0x50) = 0;
    return;
  }
  __assert_fail("p->pListFree == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyMem.c"
                ,0x5f,"void Ivy_ManAddMemory(Ivy_Man_t *)");
}

Assistant:

void Ivy_ManAddMemory( Ivy_Man_t * p )
{
    char * pMemory;
    int i, nBytes;
    int EntrySizeMax = 128;
    assert( sizeof(Ivy_Obj_t) <= EntrySizeMax );
    assert( p->pListFree == NULL );
//    assert( (Ivy_ManObjNum(p) & IVY_PAGE_MASK) == 0 );
    // allocate new memory page
    nBytes = sizeof(Ivy_Obj_t) * (1<<IVY_PAGE_SIZE) + EntrySizeMax;
    pMemory = ABC_ALLOC( char, nBytes );
    Vec_PtrPush( p->vChunks, pMemory );
    // align memory at the 32-byte boundary
    pMemory = pMemory + EntrySizeMax - (((int)(ABC_PTRUINT_T)pMemory) & (EntrySizeMax-1));
    // remember the manager in the first entry
    Vec_PtrPush( p->vPages, pMemory );
    // break the memory down into nodes
    p->pListFree = (Ivy_Obj_t *)pMemory;
    for ( i = 1; i <= IVY_PAGE_MASK; i++ )
    {
        *((char **)pMemory) = pMemory + sizeof(Ivy_Obj_t);
        pMemory += sizeof(Ivy_Obj_t);
    }
    *((char **)pMemory) = NULL;
}